

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Internal.h
# Opt level: O2

int __thiscall
chatra::IdPool<chatra::Requester,_chatra::Thread>::remove
          (IdPool<chatra::Requester,_chatra::Thread> *this,char *__filename)

{
  int extraout_EAX;
  char *local_20;
  KeyBaseType idBaseType;
  
  local_20 = __filename;
  SpinLock::lock(&this->lockValues);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_chatra::Thread_*>,_std::allocator<std::pair<const_unsigned_long,_chatra::Thread_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->values)._M_h,&local_20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->recycledIds,(value_type_conflict2 *)&local_20);
  (this->lockValues).flag.super___atomic_flag_base._M_i = false;
  return extraout_EAX;
}

Assistant:

void remove(KeyType id) {
		auto idBaseType = static_cast<KeyBaseType>(id);
		std::lock_guard<SpinLock> lock0(lockValues);
		values.erase(idBaseType);
		recycledIds.push_back(idBaseType);
	}